

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  long lVar1;
  Index IVar2;
  Module *pMVar3;
  
  IVar2 = BindingHash::FindIndex(&this->module_bindings,var);
  if ((ulong)IVar2 < (ulong)(*(long *)&this->field_0x8 - *(long *)this >> 3)) {
    lVar1 = *(long *)(*(long *)this + (ulong)IVar2 * 8);
    if (*(int *)(lVar1 + 8) != 0) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::ModuleCommand, Base = wabt::Command]"
                   );
    }
    pMVar3 = (Module *)(lVar1 + 0x10);
  }
  else {
    pMVar3 = (Module *)0x0;
  }
  return pMVar3;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = cast<ModuleCommand>(commands[index].get());
  return &command->module;
}